

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O0

void __thiscall Pl_StdioFile::Pl_StdioFile(Pl_StdioFile *this,char *identifier,FILE *f)

{
  FILE *f_local;
  char *identifier_local;
  Pl_StdioFile *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,(Pipeline *)0x0);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_StdioFile_0058b630;
  std::make_unique<Pl_StdioFile::Members,_IO_FILE*&>((_IO_FILE **)&this->m);
  return;
}

Assistant:

Pl_StdioFile::Pl_StdioFile(char const* identifier, FILE* f) :
    Pipeline(identifier, nullptr),
    m(std::make_unique<Members>(f))
{
}